

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

ssize_t __thiscall
CompressedXipReader::write(CompressedXipReader *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  element_type *peVar2;
  
  peVar2 = (this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    loadmemrd(this);
    peVar2 = (this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  iVar1 = (*(peVar2->super_ReadWriter)._vptr_ReadWriter[3])
                    (peVar2,CONCAT44(in_register_00000034,__fd),__buf);
  this->_pos = this->_pos + (int)__buf;
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

virtual void write(const uint8_t *p, size_t n)
    {
        if (!_memrd)
            loadmemrd();

        _memrd->write(p, n);
        _pos += n;
    }